

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack19_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  
  uVar2 = *in;
  auVar1 = *(undefined1 (*) [16])(in + 1);
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x3020101000008));
  auVar12 = vpmovsxbd_avx2(ZEXT816(0xf00030200010000));
  uVar3 = in[5];
  uVar4 = in[9];
  auVar7 = vpsllvd_avx2(auVar1,_DAT_00191b90);
  auVar7 = vpand_avx(auVar7,_DAT_00191ba0);
  *out = uVar2 & 0x7ffff;
  auVar9 = vpbroadcastd_avx512vl();
  uVar5 = in[8];
  auVar10 = vpermi2d_avx512vl(auVar11,ZEXT1632(auVar1),ZEXT432(uVar2));
  auVar11._8_4_ = 0x7ff00;
  auVar11._0_8_ = 0x7ff000007ff00;
  auVar11._12_4_ = 0x7ff00;
  auVar11._16_4_ = 0x7ff00;
  auVar11._20_4_ = 0x7ff00;
  auVar11._24_4_ = 0x7ff00;
  auVar11._28_4_ = 0x7ff00;
  auVar11 = vpandd_avx512vl(auVar9,auVar11);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_0018e940);
  auVar10 = vpbroadcastd_avx512vl();
  uVar6 = *(ulong *)(in + 6);
  auVar12 = vpermi2d_avx512vl(auVar12,ZEXT1632(auVar7),auVar10);
  auVar13._8_4_ = 0x7ffff;
  auVar13._0_8_ = 0x7ffff0007ffff;
  auVar13._12_4_ = 0x7ffff;
  auVar10._16_4_ = 0x7ffff;
  auVar10._0_16_ = auVar13;
  auVar10._20_4_ = 0x7ffff;
  auVar10._24_4_ = 0x7ffff;
  auVar10._28_4_ = 0x7ffff;
  auVar11 = vpblendd_avx2(auVar9,auVar11,0x80);
  auVar12 = vpor_avx2(auVar11,auVar12);
  auVar11 = vpand_avx2(auVar9,auVar10);
  auVar11 = vpblendd_avx2(auVar12,auVar11,0x4a);
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar6;
  auVar1 = vshufps_avx(ZEXT416(uVar3),auVar8,0x40);
  auVar7 = vpsrlvd_avx2(auVar1,_DAT_0019df80);
  auVar1 = vpshufd_avx(auVar8,0x50);
  auVar1 = vpsllvd_avx2(auVar1,_DAT_0019df90);
  auVar8 = vpternlogd_avx512vl(auVar1,auVar7,_DAT_0019dfa0,0xec);
  auVar1 = vpand_avx(auVar7,auVar13);
  auVar1 = vpblendd_avx2(auVar1,auVar8,6);
  *(undefined1 (*) [16])(out + 9) = auVar1;
  out[0xd] = (uint)(uVar6 >> 0x37) | (uVar5 & 0x3ff) << 9;
  out[0xe] = uVar5 >> 10 & 0x7ffff;
  out[0xf] = (uVar4 & 0xffff) << 3 | uVar5 >> 0x1d;
  return in + 10;
}

Assistant:

const uint32_t *__fastunpack19_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 11)) << (19 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 19);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 17)) << (19 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 4)) << (19 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 19);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 10)) << (19 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 19);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 16)) << (19 - 16);
  out++;

  return in + 1;
}